

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

LIBSSH2_SESSION * start_session_fixture(int *skipped,int *err)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *__s2;
  char *pcVar4;
  char **local_48;
  char **sk_1;
  char **sk;
  char *mac;
  char *crypt;
  int rc;
  int *err_local;
  int *skipped_local;
  
  pcVar3 = getenv("FIXTURE_TEST_CRYPT");
  __s2 = getenv("FIXTURE_TEST_MAC");
  *skipped = 0;
  *err = 0;
  if (pcVar3 != (char *)0x0) {
    for (sk_1 = skip_crypt; *sk_1 != (char *)0x0; sk_1 = sk_1 + 1) {
      iVar1 = strcmp(*sk_1,pcVar3);
      if (iVar1 == 0) {
        fprintf(_stderr,"unsupported crypt algorithm (%s) skipped.\n",pcVar3);
        *skipped = 1;
        return (LIBSSH2_SESSION *)0x0;
      }
    }
  }
  if (__s2 != (char *)0x0) {
    for (local_48 = skip_mac; *local_48 != (char *)0x0; local_48 = local_48 + 1) {
      iVar1 = strcmp(*local_48,__s2);
      if (iVar1 == 0) {
        fprintf(_stderr,"unsupported MAC algorithm (%s) skipped.\n",__s2);
        *skipped = 1;
        return (LIBSSH2_SESSION *)0x0;
      }
    }
  }
  iVar1 = start_openssh_fixture();
  if (iVar1 == 0) {
    uVar2 = libssh2_init(0);
    if (uVar2 == 0) {
      connected_session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0);
      if (connected_session == (LIBSSH2_SESSION *)0x0) {
        fprintf(_stderr,"libssh2_session_init_ex failed\n");
        skipped_local = (int *)0x0;
      }
      else {
        pcVar4 = getenv("FIXTURE_TRACE_ALL_CONNECT");
        if (pcVar4 == (char *)0x0) {
          pcVar4 = getenv("FIXTURE_TRACE_ALL");
          if (pcVar4 != (char *)0x0) {
            libssh2_trace(connected_session,0xffffffff);
            fprintf(_stdout,"Trace all enabled.\n");
          }
        }
        else {
          libssh2_trace(connected_session,0xffffffff);
          fprintf(_stdout,"Trace all enabled for connect_to_server.\n");
        }
        if ((pcVar3 == (char *)0x0) ||
           ((iVar1 = libssh2_session_method_pref(connected_session,2,pcVar3), iVar1 == 0 &&
            (iVar1 = libssh2_session_method_pref(connected_session,3,pcVar3), iVar1 == 0)))) {
          if ((__s2 == (char *)0x0) ||
             ((iVar1 = libssh2_session_method_pref(connected_session,4,__s2), iVar1 == 0 &&
              (iVar1 = libssh2_session_method_pref(connected_session,5,__s2), iVar1 == 0)))) {
            libssh2_session_set_blocking(connected_session,1);
            iVar1 = connect_to_server();
            if (iVar1 == 0) {
              pcVar3 = getenv("FIXTURE_TRACE_ALL_CONNECT");
              if (pcVar3 != (char *)0x0) {
                libssh2_trace(connected_session,0);
              }
              skipped_local = (int *)connected_session;
            }
            else {
              *err = iVar1;
              skipped_local = (int *)0x0;
            }
          }
          else {
            fprintf(_stderr,
                    "libssh2_session_method_pref MAC failed (probably disabled in the build): \'%s\'\n"
                    ,__s2);
            skipped_local = (int *)0x0;
          }
        }
        else {
          fprintf(_stderr,
                  "libssh2_session_method_pref CRYPT failed (probably disabled in the build): \'%s\'\n"
                  ,pcVar3);
          skipped_local = (int *)0x0;
        }
      }
    }
    else {
      fprintf(_stderr,"libssh2_init failed (%d)\n",(ulong)uVar2);
      skipped_local = (int *)0x0;
    }
  }
  else {
    skipped_local = (int *)0x0;
  }
  return (LIBSSH2_SESSION *)skipped_local;
}

Assistant:

LIBSSH2_SESSION *start_session_fixture(int *skipped, int *err)
{
    int rc;

    const char *crypt = getenv("FIXTURE_TEST_CRYPT");
    const char *mac = getenv("FIXTURE_TEST_MAC");

    *skipped = 0;
    *err = LIBSSH2_ERROR_NONE;

    if(crypt) {
        char const * const *sk;
        for(sk = skip_crypt; *sk; ++sk) {
            if(strcmp(*sk, crypt) == 0) {
                fprintf(stderr, "unsupported crypt algorithm (%s) skipped.\n",
                                crypt);
                *skipped = 1;
                return NULL;
            }
        }
    }

    if(mac) {
        char const * const *sk;
        for(sk = skip_mac; *sk; ++sk) {
            if(strcmp(*sk, mac) == 0) {
                fprintf(stderr, "unsupported MAC algorithm (%s) skipped.\n",
                                mac);
                *skipped = 1;
                return NULL;
            }
        }
    }

    rc = start_openssh_fixture();
    if(rc) {
        return NULL;
    }
    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2_init failed (%d)\n", rc);
        return NULL;
    }

    connected_session = libssh2_session_init_ex(NULL, NULL, NULL, NULL);
    if(!connected_session) {
        fprintf(stderr, "libssh2_session_init_ex failed\n");
        return NULL;
    }

    if(getenv("FIXTURE_TRACE_ALL_CONNECT")) {
        libssh2_trace(connected_session, ~0);
        fprintf(stdout, "Trace all enabled for connect_to_server.\n");
    }
    else if(getenv("FIXTURE_TRACE_ALL")) {
        libssh2_trace(connected_session, ~0);
        fprintf(stdout, "Trace all enabled.\n");
    }

    /* Override crypt algorithm for the test */
    if(crypt) {
        if(libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_CRYPT_CS, crypt) ||
           libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_CRYPT_SC, crypt)) {
            fprintf(stderr, "libssh2_session_method_pref CRYPT failed "
                            "(probably disabled in the build): '%s'\n", crypt);
            return NULL;
        }
    }

    /* Override mac algorithm for the test */
    if(mac) {
        if(libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_MAC_CS, mac) ||
           libssh2_session_method_pref(connected_session,
                                       LIBSSH2_METHOD_MAC_SC, mac)) {
            fprintf(stderr, "libssh2_session_method_pref MAC failed "
                            "(probably disabled in the build): '%s'\n", mac);
            return NULL;
        }
    }

    libssh2_session_set_blocking(connected_session, 1);

    rc = connect_to_server();
    if(rc != LIBSSH2_ERROR_NONE) {
        *err = rc;
        return NULL;
    }

    if(getenv("FIXTURE_TRACE_ALL_CONNECT")) {
        libssh2_trace(connected_session, 0);
    }

    return connected_session;
}